

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

uint32_t helper_neon_qrdmlsh_s16_arm(CPUARMState *env,uint32_t src1,uint32_t src2,uint32_t src3)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = ((int)(short)src3 << 0xf | 0x4000U) - (int)(short)src2 * (int)(short)src1;
  uVar3 = iVar2 >> 0xf;
  if ((int)(short)uVar3 != uVar3) {
    (env->vfp).qc[0] = 1;
    uVar3 = iVar2 >> 0x1f ^ 0x7fff;
  }
  iVar2 = (((int)src3 >> 1 & 0xffff8000U) - ((int)src2 >> 0x10) * ((int)src1 >> 0x10)) + 0x4000;
  uVar1 = iVar2 >> 0xf;
  if ((int)(short)uVar1 != uVar1) {
    (env->vfp).qc[0] = 1;
    uVar1 = iVar2 >> 0x1f ^ 0x7fff;
  }
  return uVar1 << 0x10 | uVar3 & 0xffff;
}

Assistant:

uint32_t HELPER(neon_qrdmlsh_s16)(CPUARMState *env, uint32_t src1,
                                  uint32_t src2, uint32_t src3)
{
    uint16_t e1 = inl_qrdmlsh_s16(env, src1, src2, src3);
    uint16_t e2 = inl_qrdmlsh_s16(env, src1 >> 16, src2 >> 16, src3 >> 16);
    return deposit32(e1, 16, 16, e2);
}